

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDataBlock.cpp
# Opt level: O2

vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *
ZXing::DataMatrix::GetDataBlocks
          (vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
           *__return_storage_ptr__,ByteArray *rawCodewords,Version *version,bool fix259)

{
  pointer puVar1;
  uchar *puVar2;
  int iVar3;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *pvVar4;
  ulong uVar5;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *pvVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_78;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *local_60;
  size_type local_58;
  DataBlock local_50;
  
  local_58 = (long)(version->ecBlocks).blocks[1].count + (long)(version->ecBlocks).blocks[0].count;
  local_78.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = __return_storage_ptr__;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::reserve
            (&local_78,local_58);
  for (lVar17 = 0x18; pvVar4 = local_60, lVar17 != 0x28; lVar17 = lVar17 + 8) {
    for (iVar15 = 0;
        iVar15 < *(int *)((long)&((Version *)
                                 (&((Version *)
                                   (&((Version *)(&version->ecBlocks + -1))->ecBlocks + -1))->
                                   ecBlocks + -1))->ecBlocks + lVar17 + 0xffffffffffffffecU);
        iVar15 = iVar15 + 1) {
      local_50.numDataCodewords = *(int *)((long)(version->ecBlocks).blocks + lVar17 + -0x14);
      ByteArray::ByteArray
                (&local_50.codewords,
                 local_50.numDataCodewords + (version->ecBlocks).codewordsPerBlock);
      std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
      emplace_back<ZXing::DataMatrix::DataBlock>(&local_78,&local_50);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50.codewords)
      ;
    }
  }
  iVar15 = *(int *)&((local_78.
                      super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start)->codewords).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
           *(int *)&((local_78.
                      super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start)->codewords).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  uVar10 = (long)iVar15 - (long)(version->ecBlocks).codewordsPerBlock;
  uVar5 = uVar10 - 1;
  uVar8 = 0;
  iVar16 = (int)local_58;
  uVar11 = 0;
  if (0 < iVar16) {
    uVar11 = local_58 & 0xffffffff;
  }
  uVar12 = 0;
  if (0 < (int)uVar5) {
    uVar12 = uVar5 & 0xffffffff;
  }
  lVar17 = 0;
  for (; uVar8 != uVar12; uVar8 = uVar8 + 1) {
    lVar17 = (long)(int)lVar17;
    for (lVar14 = 0; uVar11 << 5 != lVar14; lVar14 = lVar14 + 0x20) {
      puVar1 = (rawCodewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar17;
      lVar17 = lVar17 + 1;
      *(uchar *)(*(long *)((long)&((local_78.
                                    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->codewords).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar14) + uVar8) =
           *puVar1;
    }
  }
  iVar3 = version->symbolHeight;
  lVar14 = 0;
  uVar8 = 0;
  if (0 < iVar16) {
    uVar8 = local_58 & 0xffffffff;
  }
  lVar17 = (long)(int)lVar17;
  uVar12 = 8;
  if (iVar3 != 0x90) {
    uVar12 = uVar8;
  }
  for (; uVar12 * 0x20 != lVar14; lVar14 = lVar14 + 0x20) {
    puVar1 = (rawCodewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + lVar17;
    lVar17 = lVar17 + 1;
    *(uchar *)(*(long *)((long)&((local_78.
                                  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->codewords).
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar14) + uVar5) =
         *puVar1;
  }
  while( true ) {
    iVar9 = (int)uVar10;
    if (iVar15 <= iVar9) break;
    lVar17 = (long)(int)lVar17;
    for (iVar13 = 0; (int)uVar11 != iVar13; iVar13 = iVar13 + 1) {
      iVar7 = iVar13;
      if (iVar3 == 0x90 && fix259) {
        iVar7 = (iVar13 + 8) % iVar16;
      }
      puVar2 = (rawCodewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar17;
      lVar17 = lVar17 + 1;
      local_78.
      super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].codewords.
      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[(int)(iVar9 - (uint)(7 < iVar7 && iVar3 == 0x90))] = *puVar2;
    }
    uVar10 = (ulong)(iVar9 + 1);
  }
  pvVar6 = local_60;
  if ((int)lVar17 ==
      *(int *)&(rawCodewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
      *(int *)&(rawCodewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start) {
    (local_60->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_60->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_60->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar6 = &local_78;
  }
  (pvVar6->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::~vector
            (&local_78);
  return pvVar4;
}

Assistant:

std::vector<DataBlock> GetDataBlocks(const ByteArray& rawCodewords, const Version& version, bool fix259)
{
	// First count the total number of data blocks
	// Now establish DataBlocks of the appropriate size and number of data codewords
	auto& ecBlocks = version.ecBlocks;
	const int numResultBlocks = ecBlocks.numBlocks();
	std::vector<DataBlock> result;
	result.reserve(numResultBlocks);
	for (auto& ecBlock : ecBlocks.blocks)
		for (int i = 0; i < ecBlock.count; i++)
			result.push_back({ecBlock.dataCodewords, ByteArray(ecBlocks.codewordsPerBlock + ecBlock.dataCodewords)});

	// All blocks have the same amount of data, except that the last n
	// (where n may be 0) have 1 less byte. Figure out where these start.
	// TODO(bbrown): There is only one case where there is a difference for Data Matrix for size 144
	const int numCodewords = Size(result[0].codewords);
	const int numDataCodewords = numCodewords - ecBlocks.codewordsPerBlock;

	// The last elements of result may be 1 element shorter for 144 matrix
	// first fill out as many elements as all of them have minus 1
	int rawCodewordsOffset = 0;
	for (int i = 0; i < numDataCodewords - 1; i++)
		for (int j = 0; j < numResultBlocks; j++)
			result[j].codewords[i] = rawCodewords[rawCodewordsOffset++];

	// Fill out the last data block in the longer ones
	const bool size144x144 = version.symbolHeight == 144;
	const int numLongerBlocks = size144x144 ? 8 : numResultBlocks;
	for (int j = 0; j < numLongerBlocks; j++)
		result[j].codewords[numDataCodewords - 1] = rawCodewords[rawCodewordsOffset++];

	// Now add in error correction blocks
	for (int i = numDataCodewords; i < numCodewords; i++) {
		for (int j = 0; j < numResultBlocks; j++) {
			int jOffset = size144x144 && fix259 ? (j + 8) % numResultBlocks : j;
			int iOffset = size144x144 && jOffset > 7 ? i - 1 : i;
			result[jOffset].codewords[iOffset] = rawCodewords[rawCodewordsOffset++];
		}
	}

	if (rawCodewordsOffset != Size(rawCodewords))
		return {};

	return result;
}